

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

float __thiscall gui::Slider::getThumbWidth(Slider *this)

{
  element_type *peVar1;
  float *pfVar2;
  long in_RDI;
  double dVar3;
  float numThumbPositions;
  float local_10;
  float local_c;
  
  if ((*(float *)(in_RDI + 0x254) != 0.0) || (NAN(*(float *)(in_RDI + 0x254)))) {
    dVar3 = std::floor((double)(ulong)(uint)((*(float *)(in_RDI + 0x24c) -
                                             *(float *)(in_RDI + 0x248)) /
                                            *(float *)(in_RDI + 0x254)));
    local_c = SUB84(dVar3,0) + 1.0;
  }
  else {
    local_c = *(float *)(in_RDI + 0x22c);
  }
  local_10 = *(float *)(in_RDI + 0x22c) / local_c;
  peVar1 = std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x28c76f);
  pfVar2 = std::max<float>(&local_10,&peVar1->thumbMinWidth_);
  return *pfVar2;
}

Assistant:

float Slider::getThumbWidth() const {
    float numThumbPositions;
    if (step_ == 0.0f) {
        numThumbPositions = size_.x;
    } else {
        numThumbPositions = std::floor((range_.second - range_.first) / step_) + 1.0f;
    }
    return std::max(size_.x / numThumbPositions, style_->thumbMinWidth_);
}